

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_write_compressed_pixels
              (fitsfile *fptr,int datatype,LONGLONG fpixel,LONGLONG npixel,int nullcheck,void *array
              ,void *nullval,int *status)

{
  long lVar1;
  long lVar2;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  int *in_stack_00000010;
  char *arrayptr;
  long lastcoord [6];
  long firstcoord [6];
  long nplane;
  LONGLONG dimsize [6];
  LONGLONG last1;
  LONGLONG last0;
  LONGLONG tlast;
  LONGLONG tfirst;
  long nread;
  long naxes [6];
  int bytesperpixel;
  int ii;
  int naxis;
  void *in_stack_000001e0;
  int in_stack_000001ec;
  long *in_stack_000001f0;
  long *in_stack_000001f8;
  int in_stack_00000204;
  fitsfile *in_stack_00000208;
  void *in_stack_00000230;
  int *in_stack_00000238;
  int *in_stack_fffffffffffffe58;
  int *in_stack_fffffffffffffe60;
  fitsfile *in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  int nlen;
  fitsfile *in_stack_fffffffffffffe78;
  long local_168 [2];
  long *local_158;
  long local_138 [2];
  long *in_stack_fffffffffffffed8;
  long *in_stack_fffffffffffffee0;
  long in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  fitsfile *in_stack_fffffffffffffef8;
  long *local_100;
  long local_f8;
  long *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff18;
  void *in_stack_ffffffffffffff20;
  void *in_stack_ffffffffffffff28;
  long *in_stack_ffffffffffffff30;
  int *in_stack_ffffffffffffff38;
  long local_b0;
  long local_a8;
  long local_98 [7];
  int local_5c;
  int local_58;
  int local_54;
  long local_40;
  long local_38;
  int local_1c;
  
  nlen = (int)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  if (*in_stack_00000010 < 1) {
    local_40 = in_RCX;
    local_38 = in_RDX;
    local_5c = ffpxsz(in_ESI);
    for (local_58 = 0; local_58 < 6; local_58 = local_58 + 1) {
      local_98[local_58] = 1;
      local_138[local_58] = 0;
      local_168[local_58] = 0;
    }
    ffgidm(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    ffgisz(in_stack_fffffffffffffe78,nlen,(long *)in_stack_fffffffffffffe68,
           in_stack_fffffffffffffe60);
    local_f8 = 1;
    for (local_58 = 1; local_58 < 6; local_58 = local_58 + 1) {
      (&local_f8)[local_58] = (&local_f8)[local_58 + -1] * local_98[local_58 + -1];
    }
    local_a8 = local_38 + -1;
    local_b0 = local_a8 + local_40 + -1;
    for (local_58 = local_54 + -1; lVar2 = local_168[1], lVar1 = local_168[0], -1 < local_58;
        local_58 = local_58 + -1) {
      local_138[local_58] = local_a8 / (&local_f8)[local_58];
      local_168[local_58] = local_b0 / (&local_f8)[local_58];
      local_a8 = local_a8 - local_138[local_58] * (&local_f8)[local_58];
      local_b0 = local_b0 - local_168[local_58] * (&local_f8)[local_58];
    }
    if (local_54 == 1) {
      local_138[0] = local_138[0] + 1;
      local_168[0] = local_168[0] + 1;
      fits_write_compressed_img
                (in_stack_00000208,in_stack_00000204,in_stack_000001f8,in_stack_000001f0,
                 in_stack_000001ec,in_stack_000001e0,in_stack_00000230,in_stack_00000238);
      local_1c = *in_stack_00000010;
    }
    else {
      if (local_54 == 2) {
        fits_write_compressed_img_plane
                  (in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                   in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,in_stack_ffffffffffffff20,
                   in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
      }
      else {
        if (local_54 != 3) {
          ffpmsg((char *)0x1edd0d);
          *in_stack_00000010 = 0x19d;
          return 0x19d;
        }
        if ((((local_138[0] == 0) && (local_138[1] == 0)) && (local_168[0] == local_98[0] + -1)) &&
           (local_168[1] == local_98[1] + -1)) {
          for (local_58 = 0; local_58 < 6; local_58 = local_58 + 1) {
            local_138[local_58] = local_138[local_58] + 1;
            local_168[local_58] = local_168[local_58] + 1;
          }
          fits_write_compressed_img
                    (in_stack_00000208,in_stack_00000204,in_stack_000001f8,in_stack_000001f0,
                     in_stack_000001ec,in_stack_000001e0,in_stack_00000230,in_stack_00000238);
          return *in_stack_00000010;
        }
        local_100 = in_stack_fffffffffffffed8;
        if ((long)in_stack_fffffffffffffed8 < (long)local_158) {
          local_168[0] = local_98[0] + -1;
          local_168[1] = local_98[1] + -1;
        }
        for (; (long)local_100 <= (long)local_158; local_100 = (long *)((long)local_100 + 1)) {
          if (local_100 == local_158) {
            local_168[0] = lVar1;
            local_168[1] = lVar2;
          }
          fits_write_compressed_img_plane
                    (in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,in_stack_fffffffffffffef0,
                     in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                     in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,in_stack_ffffffffffffff20,
                     in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
          local_138[0] = 0;
          local_138[1] = 0;
        }
      }
      local_1c = *in_stack_00000010;
    }
  }
  else {
    local_1c = *in_stack_00000010;
  }
  return local_1c;
}

Assistant:

int fits_write_compressed_pixels(fitsfile *fptr, /* I - FITS file pointer   */
            int  datatype,  /* I - datatype of the array to be written      */
            LONGLONG   fpixel,  /* I - 'first pixel to write          */
            LONGLONG   npixel,  /* I - number of pixels to write      */
            int  nullcheck,  /* I - 0 for no null checking                   */
                             /*     1: pixels that are = nullval will be     */
                             /*     written with the FITS null pixel value   */
                             /*     (floating point arrays only)             */
            void *array,      /* I - array of values to write                */
            void *nullval,    /* I - value used to represent undefined pixels*/
            int  *status)     /* IO - error status                           */
/*
   Write a consecutive set of pixels to a compressed image.  This routine
   interpretes the n-dimensional image as a long one-dimensional array. 
   This is actually a rather inconvenient way to write compressed images in
   general, and could be rather inefficient if the requested pixels to be
   written are located in many different image compression tiles.    

   The general strategy used here is to write the requested pixels in blocks
   that correspond to rectangular image sections.  
*/
{
    int naxis, ii, bytesperpixel;
    long naxes[MAX_COMPRESS_DIM], nread;
    LONGLONG tfirst, tlast, last0, last1, dimsize[MAX_COMPRESS_DIM];
    long nplane, firstcoord[MAX_COMPRESS_DIM], lastcoord[MAX_COMPRESS_DIM];
    char *arrayptr;

    if (*status > 0)
        return(*status);

    arrayptr = (char *) array;

    /* get size of array pixels, in bytes */
    bytesperpixel = ffpxsz(datatype);

    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        naxes[ii] = 1;
        firstcoord[ii] = 0;
        lastcoord[ii] = 0;
    }

    /*  determine the dimensions of the image to be written */
    ffgidm(fptr, &naxis, status);
    ffgisz(fptr, MAX_COMPRESS_DIM, naxes, status);

    /* calc the cumulative number of pixels in each successive dimension */
    dimsize[0] = 1;
    for (ii = 1; ii < MAX_COMPRESS_DIM; ii++)
         dimsize[ii] = dimsize[ii - 1] * naxes[ii - 1];

    /*  determine the coordinate of the first and last pixel in the image */
    /*  Use zero based indexes here */
    tfirst = fpixel - 1;
    tlast = tfirst + npixel - 1;
    for (ii = naxis - 1; ii >= 0; ii--)
    {
        firstcoord[ii] = (long) (tfirst / dimsize[ii]);
        lastcoord[ii]  = (long) (tlast / dimsize[ii]);
        tfirst = tfirst - firstcoord[ii] * dimsize[ii];
        tlast = tlast - lastcoord[ii] * dimsize[ii];
    }

    /* to simplify things, treat 1-D, 2-D, and 3-D images as separate cases */

    if (naxis == 1)
    {
        /* Simple: just write the requested range of pixels */

        firstcoord[0] = firstcoord[0] + 1;
        lastcoord[0] = lastcoord[0] + 1;
        fits_write_compressed_img(fptr, datatype, firstcoord, lastcoord,
            nullcheck, array, nullval, status);
        return(*status);
    }
    else if (naxis == 2)
    {
        nplane = 0;  /* write 1st (and only) plane of the image */
        fits_write_compressed_img_plane(fptr, datatype, bytesperpixel,
          nplane, firstcoord, lastcoord, naxes, nullcheck,
          array, nullval, &nread, status);
    }
    else if (naxis == 3)
    {
        /* test for special case: writing an integral number of planes */
        if (firstcoord[0] == 0 && firstcoord[1] == 0 &&
            lastcoord[0] == naxes[0] - 1 && lastcoord[1] == naxes[1] - 1)
        {
            for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
            {
                /* convert from zero base to 1 base */
                (firstcoord[ii])++;
                (lastcoord[ii])++;
            }

            /* we can write the contiguous block of pixels in one go */
            fits_write_compressed_img(fptr, datatype, firstcoord, lastcoord,
                nullcheck, array, nullval, status);
            return(*status);
        }

        /* save last coordinate in temporary variables */
        last0 = lastcoord[0];
        last1 = lastcoord[1];

        if (firstcoord[2] < lastcoord[2])
        {
            /* we will write up to the last pixel in all but the last plane */
            lastcoord[0] = naxes[0] - 1;
            lastcoord[1] = naxes[1] - 1;
        }

        /* write one plane of the cube at a time, for simplicity */
        for (nplane = firstcoord[2]; nplane <= lastcoord[2]; nplane++)
        {
            if (nplane == lastcoord[2])
            {
                lastcoord[0] = (long) last0;
                lastcoord[1] = (long) last1;
            }

            fits_write_compressed_img_plane(fptr, datatype, bytesperpixel,
              nplane, firstcoord, lastcoord, naxes, nullcheck,
              arrayptr, nullval, &nread, status);

            /* for all subsequent planes, we start with the first pixel */
            firstcoord[0] = 0;
            firstcoord[1] = 0;

            /* increment pointers to next elements to be written */
            arrayptr = arrayptr + nread * bytesperpixel;
        }
    }
    else
    {
        ffpmsg("only 1D, 2D, or 3D images are currently supported");
        return(*status = DATA_COMPRESSION_ERR);
    }

    return(*status);
}